

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void jmp_patchval(FuncState *fs,BCPos list,BCPos vtarget,BCReg reg,BCPos dtarget)

{
  BCPos BVar1;
  int iVar2;
  BCPos next;
  BCPos dtarget_local;
  BCReg reg_local;
  BCPos vtarget_local;
  BCPos list_local;
  FuncState *fs_local;
  
  reg_local = list;
  while (reg_local != 0xffffffff) {
    BVar1 = jmp_next(fs,reg_local);
    iVar2 = jmp_patchtestreg(fs,reg_local,reg);
    if (iVar2 == 0) {
      jmp_patchins(fs,reg_local,dtarget);
      reg_local = BVar1;
    }
    else {
      jmp_patchins(fs,reg_local,vtarget);
      reg_local = BVar1;
    }
  }
  return;
}

Assistant:

static void jmp_patchval(FuncState *fs, BCPos list, BCPos vtarget,
			 BCReg reg, BCPos dtarget)
{
  while (list != NO_JMP) {
    BCPos next = jmp_next(fs, list);
    if (jmp_patchtestreg(fs, list, reg))
      jmp_patchins(fs, list, vtarget);  /* Jump to target with value. */
    else
      jmp_patchins(fs, list, dtarget);  /* Jump to default target. */
    list = next;
  }
}